

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void jessilib::advance_whitespace<char32_t>
               (basic_string_view<char32_t,_std::char_traits<char32_t>_> *in_data)

{
  value_type_conflict4 vVar1;
  bool bVar2;
  const_reference pvVar3;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> *in_data_local;
  
  while( true ) {
    bVar2 = std::basic_string_view<char32_t,_std::char_traits<char32_t>_>::empty(in_data);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      return;
    }
    pvVar3 = std::basic_string_view<char32_t,_std::char_traits<char32_t>_>::front(in_data);
    vVar1 = *pvVar3;
    if (((1 < (uint)(vVar1 + L'\xfffffff7')) && (vVar1 != L'\r')) && (vVar1 != L' ')) break;
    std::basic_string_view<char32_t,_std::char_traits<char32_t>_>::remove_prefix(in_data,1);
  }
  return;
}

Assistant:

void advance_whitespace(std::basic_string_view<CharT>& in_data) {
	while (!in_data.empty()) {
		switch (in_data.front()) {
			case ' ':
			case '\t':
			case '\r':
			case '\n':
				in_data.remove_prefix(1);
				break;

			default:
				return;
		}
	}
}